

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSymbols.cpp
# Opt level: O1

void slang::ast::ClockVarSymbol::fromSyntax
               (Scope *scope,ClockingItemSyntax *syntax,
               SmallVectorBase<const_slang::ast::ClockVarSymbol_*> *results)

{
  Scope *pSVar1;
  ClockingDirectionSyntax *pCVar2;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar3;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  ClockingItemSyntax *pCVar4;
  int iVar5;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar6;
  ClockVarSymbol *this;
  undefined4 extraout_var;
  SourceLocation location;
  ValueSymbol *symbol;
  Diagnostic *this_00;
  DeclaredType *target;
  Expression *pEVar7;
  long lVar8;
  LookupLocation LVar9;
  ClockingSkew CVar10;
  string_view sVar11;
  SourceRange SVar12;
  LookupLocation location_00;
  ArgumentDirection dir;
  ClockVarSymbol *arg;
  ASTContext context;
  Token name;
  undefined1 isDottedAccess;
  ArgumentDirection local_12c;
  string_view local_128;
  uint32_t local_114;
  Scope *local_110;
  Compilation *local_108;
  ClockingSkew local_100;
  ClockingSkew local_f0;
  Scope *local_e0;
  ClockingItemSyntax *local_d8;
  SmallVectorBase<const_slang::ast::ClockVarSymbol_*> *local_d0;
  ulong local_c8;
  SourceLocation local_c0;
  undefined1 local_b8 [16];
  bitmask<slang::ast::ASTFlags> local_a8;
  Symbol *pSStack_a0;
  SourceLocation SStack_98;
  SourceLocation local_90;
  ValueSymbol *pVStack_88;
  SourceRange local_78;
  undefined1 local_68 [16];
  bitmask<slang::ast::ASTFlags> local_58;
  Symbol *pSStack_50;
  SourceLocation local_48;
  SourceLocation SStack_40;
  ValueSymbol *local_38;
  
  local_108 = scope->compilation;
  pSVar1 = scope->thisSym->parentScope;
  local_d0 = results;
  LVar9 = LookupLocation::before(scope->thisSym);
  local_e0 = LVar9.scope;
  local_114 = LVar9.index;
  local_b8._8_4_ = local_114;
  local_a8.m_bits = 0x20;
  pSStack_a0 = (Symbol *)0x0;
  SStack_98 = (SourceLocation)0x0;
  local_90 = (SourceLocation)0x0;
  pVStack_88 = (ValueSymbol *)0x0;
  local_12c = In;
  local_f0.edge = None;
  local_f0.delay = (TimingControl *)0x0;
  local_100.edge = None;
  local_100.delay = (TimingControl *)0x0;
  pCVar2 = (syntax->direction).ptr;
  local_b8._0_8_ = pSVar1;
  if ((pCVar2->input).kind == InOutKeyword) {
    local_12c = InOut;
  }
  else {
    if (((pCVar2->input).info != (Info *)0x0) && (pCVar2->inputSkew != (ClockingSkewSyntax *)0x0)) {
      CVar10 = ClockingSkew::fromSyntax
                         ((ClockingSkew *)pCVar2->inputSkew,(ClockingSkewSyntax *)local_b8,
                          LVar9._8_8_);
      local_f0.delay = CVar10.delay;
      LVar9._8_8_ = local_f0.delay;
      LVar9.scope = local_e0;
      local_f0.edge = CVar10.edge;
    }
    local_e0 = LVar9.scope;
    pCVar2 = (syntax->direction).ptr;
    if ((pCVar2->output).info != (Info *)0x0) {
      local_12c = InOut - ((pCVar2->input).info == (Info *)0x0);
      if (pCVar2->outputSkew != (ClockingSkewSyntax *)0x0) {
        CVar10 = ClockingSkew::fromSyntax
                           ((ClockingSkew *)pCVar2->outputSkew,(ClockingSkewSyntax *)local_b8,
                            LVar9._8_8_);
        local_100.delay = CVar10.delay;
        local_100.edge = CVar10.edge;
      }
    }
  }
  local_110 = pSVar1;
  if (local_12c - Out < 2) {
    ASTContext::resetFlags
              ((ASTContext *)local_68,(ASTContext *)local_b8,(bitmask<slang::ast::ASTFlags>)0x100000
              );
    pVStack_88 = local_38;
    SStack_98 = local_48;
    local_90 = SStack_40;
    local_a8.m_bits = local_58.m_bits;
    pSStack_a0 = pSStack_50;
    local_b8._0_8_ = local_68._0_8_;
    local_b8._8_8_ = local_68._8_8_;
  }
  local_c8 = (syntax->decls).elements._M_extent._M_extent_value + 1;
  if (1 < local_c8) {
    local_c8 = local_c8 >> 1;
    lVar8 = 0;
    local_d8 = syntax;
    do {
      pCVar4 = local_d8;
      pSVar1 = local_110;
      ppSVar6 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           ((long)&(((local_d8->decls).elements._M_ptr)->super_ConstTokenOrSyntax).
                                   super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                           + lVar8));
      pSVar3 = *ppSVar6;
      local_68._0_8_ = *(undefined8 *)(pSVar3 + 1);
      local_68._8_8_ = pSVar3[1].parent;
      local_128 = parsing::Token::valueText((Token *)local_68);
      local_c0 = parsing::Token::location((Token *)local_68);
      this = BumpAllocator::
             emplace<slang::ast::ClockVarSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::ArgumentDirection&,slang::ast::ClockingSkew&,slang::ast::ClockingSkew&>
                       (&local_108->super_BumpAllocator,&local_128,&local_c0,&local_12c,&local_f0,
                        &local_100);
      local_128._M_len = (size_t)this;
      (this->super_VariableSymbol).super_ValueSymbol.super_Symbol.originatingSyntax = pSVar3;
      syntax_00._M_ptr =
           (pCVar4->super_MemberSyntax).attributes.
           super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
      syntax_00._M_extent._M_extent_value =
           (pCVar4->super_MemberSyntax).attributes.
           super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
           _M_extent_value;
      Symbol::setAttributes((Symbol *)this,pSVar1,syntax_00);
      SmallVectorBase<slang::ast::ClockVarSymbol_const*>::
      emplace_back<slang::ast::ClockVarSymbol_const*const&>
                ((SmallVectorBase<slang::ast::ClockVarSymbol_const*> *)local_d0,
                 (ClockVarSymbol **)&local_128);
      if (pSVar3[1].previewNode == (SyntaxNode *)0x0) {
        sVar11 = parsing::Token::valueText((Token *)local_68);
        local_78 = parsing::Token::range((Token *)local_68);
        isDottedAccess = local_78.endLoc._0_1_;
        location_00.index = local_114;
        location_00.scope = local_e0;
        location_00._12_4_ = 0;
        symbol = (ValueSymbol *)
                 Lookup::unqualifiedAt
                           (pSVar1,sVar11,location_00,local_78,(bitmask<slang::ast::LookupFlags>)0x0
                           );
        if (symbol == (ValueSymbol *)0x0) {
          symbol = (ValueSymbol *)0x0;
        }
        else if (1 < (symbol->super_Symbol).kind - Net) {
          SVar12 = parsing::Token::range((Token *)local_68);
          this_00 = ASTContext::addDiag((ASTContext *)local_b8,(DiagCode)0x550006,SVar12);
          sVar11 = parsing::Token::valueText((Token *)local_68);
          Diagnostic::operator<<(this_00,sVar11);
          Diagnostic::addNote(this_00,(DiagCode)0x50001,(symbol->super_Symbol).location);
          symbol = (ValueSymbol *)0x0;
        }
        if (symbol == (ValueSymbol *)0x0) {
          *(Type **)(local_128._M_len + 0x48) = local_108->errorType;
        }
        else {
          target = Symbol::getDeclaredType(&symbol->super_Symbol);
          DeclaredType::setLink((DeclaredType *)(local_128._M_len + 0x40),target);
          SVar12.startLoc =
               *(long *)(local_128._M_len + 8) * 0x10000000 +
               (long)*(HierarchicalReference **)(local_128._M_len + 0x18);
          SVar12.endLoc = (SourceLocation)0x0;
          pEVar7 = ValueExpressionBase::fromSymbol
                             ((ValueExpressionBase *)local_b8,(ASTContext *)symbol,(Symbol *)0x0,
                              *(HierarchicalReference **)(local_128._M_len + 0x18),SVar12,false,
                              (bool)isDottedAccess);
          if (local_12c != In) {
            ASTContext::addDriver
                      ((ASTContext *)local_b8,symbol,pEVar7,(bitmask<slang::ast::AssignFlags>)0x20);
          }
        }
      }
      else {
        iVar5 = Expression::bind((int)pSVar3[1].previewNode[1].previewNode,(sockaddr *)local_b8,0);
        pEVar7 = (Expression *)CONCAT44(extraout_var,iVar5);
        *(Type **)(local_128._M_len + 0x48) = (pEVar7->type).ptr;
        *(Expression **)(local_128._M_len + 0x60) = pEVar7;
        if (local_12c != In) {
          location = parsing::Token::location((Token *)(pSVar3[1].previewNode + 1));
          Expression::requireLValue
                    (pEVar7,(ASTContext *)local_b8,location,(bitmask<slang::ast::AssignFlags>)0x20,
                     (Expression *)0x0);
        }
      }
      lVar8 = lVar8 + 0x30;
      local_c8 = local_c8 - 1;
    } while (local_c8 != 0);
  }
  return;
}

Assistant:

void ClockVarSymbol::fromSyntax(const Scope& scope, const ClockingItemSyntax& syntax,
                                SmallVectorBase<const ClockVarSymbol*>& results) {
    // Lookups should happen in the parent of the clocking block, since other
    // clocking block members cannot reference each other.
    auto& comp = scope.getCompilation();
    auto parent = scope.asSymbol().getParentScope();
    SLANG_ASSERT(parent);

    LookupLocation ll = LookupLocation::before(scope.asSymbol());
    ASTContext context(*parent, ll, ASTFlags::NonProcedural);

    ArgumentDirection dir = ArgumentDirection::In;
    ClockingSkew inputSkew, outputSkew;
    if (syntax.direction->input.kind == TokenKind::InOutKeyword) {
        dir = ArgumentDirection::InOut;
    }
    else {
        if (syntax.direction->input) {
            if (syntax.direction->inputSkew)
                inputSkew = ClockingSkew::fromSyntax(*syntax.direction->inputSkew, context);
        }

        if (syntax.direction->output) {
            dir = syntax.direction->input ? ArgumentDirection::InOut : ArgumentDirection::Out;
            if (syntax.direction->outputSkew)
                outputSkew = ClockingSkew::fromSyntax(*syntax.direction->outputSkew, context);
        }
    }

    if (dir == ArgumentDirection::Out || dir == ArgumentDirection::InOut)
        context = context.resetFlags(ASTFlags::LValue);

    for (auto decl : syntax.decls) {
        auto name = decl->name;
        auto arg = comp.emplace<ClockVarSymbol>(name.valueText(), name.location(), dir, inputSkew,
                                                outputSkew);
        arg->setSyntax(*decl);
        arg->setAttributes(*parent, syntax.attributes);
        results.push_back(arg);

        // If there is an initializer expression we take our type from that.
        // Otherwise we need to lookup the signal in our parent scope and
        // take the type from that.
        if (decl->value) {
            auto& expr = Expression::bind(*decl->value->expr, context);
            arg->setType(*expr.type);
            arg->setInitializer(expr);

            if (dir != ArgumentDirection::In)
                expr.requireLValue(context, decl->value->equals.location(), AssignFlags::ClockVar);
        }
        else {
            auto sym = Lookup::unqualifiedAt(*parent, name.valueText(), ll, name.range());
            if (sym && sym->kind != SymbolKind::Net && sym->kind != SymbolKind::Variable) {
                auto& diag = context.addDiag(diag::InvalidClockingSignal, name.range());
                diag << name.valueText();
                diag.addNote(diag::NoteDeclarationHere, sym->location);
                sym = nullptr;
            }

            if (sym) {
                auto sourceType = sym->getDeclaredType();
                SLANG_ASSERT(sourceType);
                arg->getDeclaredType()->setLink(*sourceType);

                auto& valExpr = ValueExpressionBase::fromSymbol(
                    context, *sym, nullptr, {arg->location, arg->location + arg->name.length()});

                if (dir != ArgumentDirection::In)
                    context.addDriver(sym->as<ValueSymbol>(), valExpr, AssignFlags::ClockVar);
            }
            else {
                arg->getDeclaredType()->setType(comp.getErrorType());
            }
        }
    }
}